

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onRet(RACFGBuilder *this,FuncRetNode *funcRet,RAInstBuilder *ib)

{
  bool bVar1;
  uint uVar2;
  Error EVar3;
  long lVar4;
  RAWorkReg *pRVar5;
  FuncValue *pFVar6;
  uint32_t *puVar7;
  long in_RSI;
  long *in_RDI;
  Error _err_1;
  RegMask inOutRegs;
  RegGroup group;
  Error _err;
  RAWorkReg *workReg;
  uint32_t vIndex;
  Reg *reg;
  FuncValue *ret;
  Operand *op;
  uint32_t i;
  uint32_t opCount;
  Operand *opArray;
  FuncDetail *funcDetail;
  uint32_t in_stack_00000098;
  uint32_t in_stack_000000a0;
  uint32_t in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint32_t in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  long local_138;
  RAWorkReg *workReg_00;
  uint uVar8;
  undefined4 local_8c;
  RAWorkReg *local_88;
  FuncValue *local_80;
  FuncValue *local_78;
  ulong local_70;
  long local_68;
  long local_60;
  FuncValue *local_58;
  long local_50;
  RAWorkReg *local_48;
  RAWorkReg *local_40;
  long local_38;
  long local_30;
  undefined4 *local_28;
  RAWorkReg *local_20;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  FuncValue *local_8;
  
  local_60 = *in_RDI;
  local_50 = *(long *)(local_60 + 0x98);
  lVar4 = local_50 + 0x34;
  uVar2 = (uint)*(byte *)(in_RSI + 0x12);
  uVar8 = 0;
  do {
    if (uVar2 <= uVar8) {
      return 0;
    }
    pRVar5 = (RAWorkReg *)(in_RSI + 0x40 + (ulong)uVar8 * 0x10);
    local_14 = 0;
    local_10 = 0;
    local_8c = 0;
    local_28 = &local_8c;
    if (*(uint *)pRVar5 != 0) {
      local_70 = (ulong)uVar8;
      local_88 = pRVar5;
      local_68 = lVar4;
      local_20 = pRVar5;
      pFVar6 = FuncValuePack::operator[]
                         ((FuncValuePack *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      local_c = 0x100;
      local_80 = pFVar6;
      local_8 = pFVar6;
      bVar1 = Support::test<unsigned_int,unsigned_int>(pFVar6->_data,0x100);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        EVar3 = DebugUtils::errored(0x19);
        return EVar3;
      }
      local_78 = pFVar6;
      if ((char)(pFVar6->_data >> 0x18) != '\x16') {
        local_48 = pRVar5;
        local_40 = pRVar5;
        if ((*(uint *)pRVar5 & 7) != 1) {
          EVar3 = DebugUtils::errored(0x19);
          return EVar3;
        }
        if (*(uint *)(pRVar5 + 4) - 0x100 < 0xfffffeff) {
          workReg_00 = pRVar5;
          EVar3 = BaseRAPass::virtIndexAsWorkReg
                            ((BaseRAPass *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                             in_stack_fffffffffffffe9c,
                             (RAWorkReg **)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
          if (EVar3 != 0) {
            return EVar3;
          }
          local_38 = local_138 + 0x20;
          local_30 = local_38;
          puVar7 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                             ((RARegMask *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (RegGroup *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          in_stack_fffffffffffffe88 = *puVar7;
          in_stack_fffffffffffffe90 = 0xff;
          in_stack_fffffffffffffea0 = 0;
          local_58 = pFVar6;
          EVar3 = RAInstBuilder::add((RAInstBuilder *)CONCAT44(uVar2,uVar8),workReg_00,
                                     (RATiedFlags)((ulong)pFVar6 >> 0x20),(RegMask)pFVar6,
                                     (uint32_t)((ulong)pRVar5 >> 0x20),(uint32_t)pRVar5,(RegMask)ib,
                                     (uint32_t)funcRet,(uint32_t)this,in_stack_00000098,
                                     in_stack_000000a0);
          if (EVar3 != 0) {
            return EVar3;
          }
        }
      }
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

Error RACFGBuilder::onRet(FuncRetNode* funcRet, RAInstBuilder& ib) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    if (op.isNone()) continue;

    const FuncValue& ret = funcDetail.ret(i);
    if (ASMJIT_UNLIKELY(!ret.isReg()))
      return DebugUtils::errored(kErrorInvalidAssignment);

    // Not handled here...
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      // Register return value.
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, ret.regId(), 0, inOutRegs, BaseReg::kIdBad, 0));
      }
    }
    else {
      return DebugUtils::errored(kErrorInvalidAssignment);
    }
  }

  return kErrorOk;
}